

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *param_1,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,int num,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *low,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *up)

{
  int iVar1;
  type_conflict5 tVar2;
  int iVar3;
  ulong *puVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool *pbVar9;
  byte bVar10;
  int *piVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  uint *puVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  int32_t iVar18;
  fpclass_type fVar19;
  uint uVar20;
  bool bVar21;
  byte bVar22;
  Real val_00;
  ulong uVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  undefined1 local_358 [32];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [13];
  undefined3 uStack_2eb;
  int iStack_2e8;
  bool abStack_2e4 [4];
  undefined8 local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  cpp_dec_float<200U,_int,_void> *local_2c8;
  int *local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool abStack_244 [4];
  undefined8 local_240;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  
  bVar22 = 0;
  local_2e0 = local_2e0 & 0xffffffff00000000;
  local_358._0_16_ = (undefined1  [16])0x0;
  local_358._16_16_ = (undefined1  [16])0x0;
  local_338 = (undefined1  [16])0x0;
  local_328 = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = SUB1613((undefined1  [16])0x0,0);
  uStack_2eb = 0;
  iStack_2e8 = 0;
  abStack_2e4[0] = false;
  local_240 = 0x1c00000000;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = SUB1613((undefined1  [16])0x0,0);
  uStack_24b = 0;
  iStack_248 = 0;
  abStack_244[0] = false;
  local_2c0 = idx;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result_2,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val_00 = Tolerances::epsilon((Tolerances *)result_2.m_backend.data._M_elems._0_8_);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&epsilon.m_backend,val_00,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result_2.m_backend.data._M_elems + 2));
  pnVar16 = val;
  pnVar13 = &local_130;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = (val->m_backend).exp;
  local_130.m_backend.neg = (val->m_backend).neg;
  local_130.m_backend.fpclass = (val->m_backend).fpclass;
  local_130.m_backend.prec_elem = (val->m_backend).prec_elem;
  local_2d0 = val;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)local_2b8,0);
  pnVar16 = &(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).delta;
  lVar6 = (long)num;
LAB_0044c7d0:
  do {
    do {
      lVar8 = 0x1c;
      bVar21 = lVar6 == 0;
      lVar6 = lVar6 + -1;
      if (bVar21) {
        pnVar16 = &local_130;
        pnVar13 = local_2d0;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pnVar13->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar22 * -2 + 1) * 4);
        }
        (local_2d0->m_backend).exp = local_130.m_backend.exp;
        (local_2d0->m_backend).neg = local_130.m_backend.neg;
        (local_2d0->m_backend).fpclass = local_130.m_backend.fpclass;
        (local_2d0->m_backend).prec_elem = local_130.m_backend.prec_elem;
        return -1;
      }
      iVar1 = local_2c0[lVar6];
      pnVar13 = upd + iVar1;
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_358;
      for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      iStack_2e8 = upd[iVar1].m_backend.exp;
      abStack_2e4[0] = upd[iVar1].m_backend.neg;
      local_2e0._0_4_ = upd[iVar1].m_backend.fpclass;
      local_2e0._4_4_ = upd[iVar1].m_backend.prec_elem;
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_358,&epsilon);
      if (!tVar2) goto LAB_0044caa6;
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_2b8;
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_358,pnVar13);
      pnVar12 = pnVar13;
      if (tVar2) {
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_358;
      }
      piVar11 = &iStack_248;
      if (tVar2) {
        piVar11 = &iStack_2e8;
      }
      for (; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      iStack_248 = *piVar11;
      pbVar9 = abStack_244;
      if (tVar2) {
        pbVar9 = abStack_2e4;
      }
      abStack_244[0] = *pbVar9;
      uVar23 = CONCAT44((int)((uint)tVar2 << 0x1f) >> 0x1f,(int)((uint)tVar2 << 0x1f) >> 0x1f);
      local_240 = ~uVar23 & local_240 | local_2e0 & uVar23;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,&low[iVar1].m_backend,&vec[iVar1].m_backend);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&result.m_backend,&pnVar16->m_backend);
      result_2.m_backend.fpclass = cpp_dec_float_finite;
      result_2.m_backend.prec_elem = 0x1c;
      result_2.m_backend.data._M_elems[0] = 0;
      result_2.m_backend.data._M_elems[1] = 0;
      result_2.m_backend.data._M_elems[2] = 0;
      result_2.m_backend.data._M_elems[3] = 0;
      result_2.m_backend.data._M_elems[4] = 0;
      result_2.m_backend.data._M_elems[5] = 0;
      result_2.m_backend.data._M_elems[6] = 0;
      result_2.m_backend.data._M_elems[7] = 0;
      result_2.m_backend.data._M_elems[8] = 0;
      result_2.m_backend.data._M_elems[9] = 0;
      result_2.m_backend.data._M_elems[10] = 0;
      result_2.m_backend.data._M_elems[0xb] = 0;
      result_2.m_backend.data._M_elems[0xc] = 0;
      result_2.m_backend.data._M_elems[0xd] = 0;
      result_2.m_backend.data._M_elems[0xe] = 0;
      result_2.m_backend.data._M_elems[0xf] = 0;
      result_2.m_backend.data._M_elems[0x10] = 0;
      result_2.m_backend.data._M_elems[0x11] = 0;
      result_2.m_backend.data._M_elems[0x12] = 0;
      result_2.m_backend.data._M_elems[0x13] = 0;
      result_2.m_backend.data._M_elems[0x14] = 0;
      result_2.m_backend.data._M_elems[0x15] = 0;
      result_2.m_backend.data._M_elems[0x16] = 0;
      result_2.m_backend.data._M_elems[0x17] = 0;
      result_2.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
      result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_2.m_backend.exp = 0;
      result_2.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_2.m_backend,&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)local_358
                );
      pcVar15 = &result_2.m_backend;
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_358;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
      }
      iStack_2e8 = result_2.m_backend.exp;
      abStack_2e4[0] = result_2.m_backend.neg;
      local_2e0._0_4_ = result_2.m_backend.fpclass;
      local_2e0._4_4_ = result_2.m_backend.prec_elem;
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_358,&local_130);
    } while (!tVar2);
    puVar4 = (ulong *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_2.m_backend,(double)(*puVar4 ^ (ulong)DAT_00478010),(type *)0x0);
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&low[iVar1].m_backend,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_2.m_backend);
  } while (!tVar2);
  goto LAB_0044ce01;
LAB_0044caa6:
  pnVar13 = &epsilon;
  pnVar12 = &result_2;
  for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar12->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + ((ulong)bVar22 * -2 + 1) * 4);
    pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar12 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  result_2.m_backend.exp = epsilon.m_backend.exp;
  result_2.m_backend.neg = epsilon.m_backend.neg;
  result_2.m_backend.fpclass = epsilon.m_backend.fpclass;
  result_2.m_backend.prec_elem = epsilon.m_backend.prec_elem;
  if (epsilon.m_backend.fpclass != cpp_dec_float_finite || result_2.m_backend.data._M_elems[0] != 0)
  {
    result_2.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
  }
  tVar2 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_358,&result_2);
  if (tVar2) {
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_358;
    pnVar12 = &result_2;
    for (; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    result_2.m_backend.exp = iStack_2e8;
    result_2.m_backend.neg = abStack_2e4[0];
    result_2.m_backend.fpclass = (fpclass_type)local_2e0;
    result_2.m_backend.prec_elem = local_2e0._4_4_;
    if ((fpclass_type)local_2e0 != cpp_dec_float_finite || result_2.m_backend.data._M_elems[0] != 0)
    {
      result_2.m_backend.neg = (bool)(abStack_2e4[0] ^ 1);
    }
    tVar2 = boost::multiprecision::operator>
                      (&result_2,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_2b8);
    lVar8 = 0x1b;
    if (tVar2) {
      puVar14 = (uint *)(local_358 + 4);
      pcVar15 = &result_1.m_backend;
      for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar15->data)._M_elems[0] = *puVar14;
        puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
      }
      iVar3 = iStack_2e8;
      iVar18 = local_2e0._4_4_;
      if ((fpclass_type)local_2e0 == cpp_dec_float_finite && local_358._0_4_ == 0) {
        bVar10 = abStack_2e4[0];
        fVar19 = cpp_dec_float_finite;
        uVar20 = 0;
      }
      else {
        bVar10 = abStack_2e4[0] ^ 1;
        fVar19 = (fpclass_type)local_2e0;
        uVar20 = local_358._0_4_;
      }
    }
    else {
      puVar14 = (uint *)(local_2b8 + 4);
      pcVar15 = &result_1.m_backend;
      for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar15->data)._M_elems[0] = *puVar14;
        puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
      }
      iVar3 = iStack_248;
      bVar10 = abStack_244[0];
      fVar19 = (fpclass_type)local_240;
      iVar18 = local_240._4_4_;
      uVar20 = local_2b8._0_4_;
    }
    local_2b8._0_4_ = uVar20;
    pcVar15 = &result_1.m_backend;
    puVar14 = (uint *)(local_2b8 + 4);
    for (; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar14 = (pcVar15->data)._M_elems[0];
      pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
      puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
    }
    local_240 = CONCAT44(iVar18,fVar19);
    local_2c8 = &up[iVar1].m_backend;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    iStack_248 = iVar3;
    abStack_244[0] = (bool)bVar10;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result.m_backend,local_2c8,&vec[iVar1].m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_1.m_backend,&result.m_backend,&pnVar16->m_backend);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems[8] = 0;
    result_2.m_backend.data._M_elems[9] = 0;
    result_2.m_backend.data._M_elems[10] = 0;
    result_2.m_backend.data._M_elems[0xb] = 0;
    result_2.m_backend.data._M_elems[0xc] = 0;
    result_2.m_backend.data._M_elems[0xd] = 0;
    result_2.m_backend.data._M_elems[0xe] = 0;
    result_2.m_backend.data._M_elems[0xf] = 0;
    result_2.m_backend.data._M_elems[0x10] = 0;
    result_2.m_backend.data._M_elems[0x11] = 0;
    result_2.m_backend.data._M_elems[0x12] = 0;
    result_2.m_backend.data._M_elems[0x13] = 0;
    result_2.m_backend.data._M_elems[0x14] = 0;
    result_2.m_backend.data._M_elems[0x15] = 0;
    result_2.m_backend.data._M_elems[0x16] = 0;
    result_2.m_backend.data._M_elems[0x17] = 0;
    result_2.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_2.m_backend,&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)local_358);
    pcVar15 = &result_2.m_backend;
    pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_358;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
      pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
    }
    iStack_2e8 = result_2.m_backend.exp;
    abStack_2e4[0] = result_2.m_backend.neg;
    local_2e0._0_4_ = result_2.m_backend.fpclass;
    local_2e0._4_4_ = result_2.m_backend.prec_elem;
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_358,&local_130);
    if (tVar2) {
      pdVar5 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_2.m_backend,*pdVar5,(type *)0x0);
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_2c8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_2.m_backend);
      if (tVar2) {
LAB_0044ce01:
        puVar14 = (uint *)local_358;
        pnVar13 = &local_130;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pnVar13->m_backend).data._M_elems[0] = *puVar14;
          puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar22 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = iStack_2e8;
        local_130.m_backend.neg = abStack_2e4[0];
        local_130.m_backend.fpclass = (fpclass_type)local_2e0;
        local_130.m_backend.prec_elem = local_2e0._4_4_;
      }
    }
  }
  goto LAB_0044c7d0;
}

Assistant:

int SPxHarrisRT<R>::minDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
) const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val < 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x > theval && low[i] > R(-infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x > theval && up[i] < R(infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}